

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall fs::Path::setPath(Path *this,string *path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  value_type local_60;
  size_type local_40;
  size_type e;
  size_type b;
  string *local_18;
  string *path_local;
  Path *this_local;
  
  local_18 = path;
  path_local = &this->_complete;
  memset(&b,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&b,&this->_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&b);
  e = 0;
  while( true ) {
    e = std::__cxx11::string::find_first_not_of((string *)local_18,(ulong)&this->_separator);
    if (e == 0xffffffffffffffff) break;
    local_40 = std::__cxx11::string::find_first_of((string *)local_18,(ulong)&this->_separator);
    std::__cxx11::string::substr((ulong)&local_60,(ulong)local_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_path,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    e = local_40;
  }
  std::operator+(&local_90,local_18,&this->_separator);
  std::__cxx11::string::operator=((string *)&this->_fullpath,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  updateComplete(this);
  return this;
}

Assistant:

fs::Path& fs::Path::setPath(std::string const& path)
{
  std::vector<std::string>().swap(_path);
  std::string::size_type b = 0;

  while ((b = path.find_first_not_of(_separator, b)) != std::string::npos) {
	  auto e = path.find_first_of(_separator, b);
	  _path.push_back(path.substr(b, e - b));
	  b = e;
  }
  _fullpath = path + _separator;
  updateComplete();
  return *this;
}